

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quarticSolver.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  uint uVar2;
  ostream *poVar3;
  uint i_1;
  double *pdVar4;
  long lVar5;
  uint i;
  ulong uVar6;
  bool bVar7;
  double ce [4];
  double roots [4];
  
  pdVar4 = ce;
  testEigen();
  ce[2] = -1.87832;
  ce[3] = -0.882024;
  ce[0] = 1.87832;
  ce[1] = -0.0950376;
  uVar2 = 5;
  if ((uint)argc < 5) {
    uVar2 = argc;
  }
  for (uVar6 = 1; uVar6 < uVar2; uVar6 = uVar6 + 1) {
    dVar1 = strtod(argv[uVar6],(char **)0x0);
    ce[uVar6 - 1] = dVar1;
  }
  std::operator<<((ostream *)&std::cout,"x^4");
  uVar6 = 4;
  if (argc != 1) {
    uVar6 = (ulong)(uVar2 - 1);
  }
  lVar5 = 3;
  while (lVar5 + uVar6 != 3) {
    std::operator<<((ostream *)&std::cout," + (");
    poVar3 = std::ostream::_M_insert<double>(*pdVar4);
    std::operator<<(poVar3,")");
    bVar7 = lVar5 == 0;
    lVar5 = lVar5 + -1;
    if (bVar7) {
      std::operator<<((ostream *)&std::cout," =0\n");
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,"*x^");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    }
    pdVar4 = pdVar4 + 1;
  }
  if (uVar6 == 3) {
    std::operator<<((ostream *)&std::cout,"cubic:\n");
    uVar2 = cubicSolver(ce,roots);
  }
  else if ((int)uVar6 == 4) {
    std::operator<<((ostream *)&std::cout,"quadratic:\n");
    uVar2 = quarticSolver(ce,roots);
  }
  else {
    std::operator<<((ostream *)&std::cout,"quartic:\n");
    uVar2 = quadraticSolver(ce,roots);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Number of real roots=");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  for (uVar6 = 0; uVar2 != uVar6; uVar6 = uVar6 + 1) {
    std::operator<<((ostream *)&std::cout,"x= ");
    poVar3 = std::ostream::_M_insert<double>(roots[uVar6]);
    std::operator<<(poVar3,'\t');
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return 0;
}

Assistant:

int main(int argc, char * argv[])
{
    testEigen();
    unsigned int counts;
    double ce[4]= {1.87832,-0.0950376,-1.87832,-0.882024};
    unsigned int j=5;
    if(argc < j ) j=argc;
    for(unsigned int i=1; i< j; i++) {
        ce[i-1]=strtod(argv[i],NULL);
    }
    std::cout<<"x^4";
    if(argc == 1) j=4;
    else j--;
    for(unsigned int i=0; i< j; i++) {
        std::cout<<" + ("<<ce[i]<<")";
        if ( i != 3 ) {
            std::cout<<"*x^"<<3-i;
        } else {
            std::cout<<" =0\n";
        }
    }

    double roots[4];
    switch (j) {
    case 4:
        std::cout<<"quadratic:\n";
        counts=quarticSolver(ce,roots);
        break;
    case 3:
        std::cout<<"cubic:\n";
        counts=cubicSolver(ce,roots);
        break;
    default:
        std::cout<<"quartic:\n";
        counts=quadraticSolver(ce,roots);
    }
    std::cout<<"Number of real roots="<<counts<<std::endl;
    for(unsigned int i=0; i<counts; i++) {
        std::cout<<"x= "<<roots[i]<<'\t';
    }
    std::cout<<std::endl;
    return 0;


}